

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXBinaryTokenizer.cpp
# Opt level: O3

bool Assimp::FBX::anon_unknown_3::ReadScope
               (TokenList *output_tokens,char *input,char **cursor,char *end,bool is64bits)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  long lVar6;
  long *plVar7;
  char *pcVar8;
  byte *pbVar9;
  size_type *psVar10;
  ulong uVar11;
  int iVar12;
  undefined7 in_register_00000081;
  byte *pbVar13;
  char **ppcVar14;
  undefined8 uVar15;
  ulong uVar16;
  char *pcVar17;
  vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>> *this;
  char *sb;
  char *se;
  string local_d8;
  char **local_b8;
  byte *local_b0;
  int local_a4;
  uint64_t local_a0;
  vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>> *local_98;
  uint64_t local_90;
  ulong local_88;
  ulong local_80;
  uint32_t local_74;
  byte *local_70;
  undefined8 local_68;
  byte local_60 [16];
  char *local_50;
  undefined8 local_48;
  char *local_40;
  char *local_38;
  
  iVar12 = (int)CONCAT71(in_register_00000081,is64bits);
  local_98 = (vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>> *)
             output_tokens;
  if (iVar12 == 0) {
    uVar4 = ReadWord(input,cursor,end);
    local_88 = (ulong)uVar4;
  }
  else {
    local_88 = ReadDoubleWord(input,cursor,end);
  }
  if (local_88 != 0) {
    local_b8 = cursor;
    if ((ulong)((long)end - (long)input) < local_88) {
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d8,"block offset is out of range","");
      TokenizeError(&local_d8,(long)*local_b8 - (long)input);
    }
    if (local_88 < (ulong)((long)*cursor - (long)input)) {
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d8,"block offset is negative out of range","");
      TokenizeError(&local_d8,(long)*local_b8 - (long)input);
    }
    local_a4 = iVar12;
    if (is64bits) {
      local_a0 = ReadDoubleWord(input,cursor,end);
      local_90 = ReadDoubleWord(input,cursor,end);
    }
    else {
      uVar4 = ReadWord(input,cursor,end);
      local_a0 = (uint64_t)uVar4;
      uVar4 = ReadWord(input,cursor,end);
      local_90 = (uint64_t)uVar4;
    }
    ReadString(&local_38,&local_40,input,cursor,end,false,false);
    local_d8._M_dataplus._M_p = (pointer)operator_new(0x28);
    this = local_98;
    pcVar17 = *cursor;
    *(char **)local_d8._M_dataplus._M_p = local_38;
    *(char **)((long)local_d8._M_dataplus._M_p + 8) = local_40;
    *(undefined4 *)((long)local_d8._M_dataplus._M_p + 0x10) = 5;
    *(long *)((long)local_d8._M_dataplus._M_p + 0x18) = (long)pcVar17 - (long)input;
    *(undefined4 *)((long)local_d8._M_dataplus._M_p + 0x20) = 0xffffffff;
    std::vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>>::
    emplace_back<Assimp::FBX::Token_const*>(local_98,(Token **)&local_d8);
    pcVar17 = *cursor;
    pcVar8 = pcVar17;
    if (local_a0 != 0) {
      local_b0 = (byte *)(pcVar17 + local_90);
      uVar1 = local_a0 - 1;
      uVar11 = 0;
      uVar16 = 1;
      ppcVar14 = cursor;
      local_50 = pcVar17;
      do {
        pbVar13 = local_b0;
        pbVar9 = (byte *)*cursor;
        local_80 = uVar11;
        if (pbVar9 == local_b0) {
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_d8,"cannot ReadData, out of bounds reading length","");
          TokenizeError(&local_d8,(long)*local_b8 - (long)input);
        }
        local_60[0] = *pbVar9;
        uVar15 = CONCAT71((int7)((ulong)ppcVar14 >> 8),local_60[0]);
        *cursor = (char *)(pbVar9 + 1);
        switch((uint)local_60[0]) {
        case 0x43:
          pbVar13 = pbVar9 + 2;
          break;
        case 0x44:
        case 0x4c:
          pbVar13 = pbVar9 + 9;
          break;
        case 0x45:
        case 0x47:
        case 0x48:
        case 0x4a:
        case 0x4b:
        case 0x4d:
        case 0x4e:
        case 0x4f:
        case 0x50:
        case 0x51:
switchD_005fdcc5_caseD_45:
          local_70 = local_60;
          local_68 = 1;
          local_60[1] = 0;
          plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x6f24f7);
          local_d8._M_dataplus._M_p = (pointer)*plVar7;
          psVar10 = (size_type *)(plVar7 + 2);
          if ((size_type *)local_d8._M_dataplus._M_p == psVar10) {
            local_d8.field_2._M_allocated_capacity = *psVar10;
            local_d8.field_2._8_8_ = plVar7[3];
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          }
          else {
            local_d8.field_2._M_allocated_capacity = *psVar10;
          }
          local_d8._M_string_length = plVar7[1];
          *plVar7 = (long)psVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          TokenizeError(&local_d8,(long)*local_b8 - (long)input);
        case 0x46:
        case 0x49:
          pbVar13 = pbVar9 + 5;
          break;
        case 0x52:
          uVar4 = ReadWord(input,cursor,(char *)local_b0);
          pbVar13 = (byte *)(*cursor + uVar4);
          *cursor = (char *)pbVar13;
          goto LAB_005fde0b;
        case 0x53:
          ReadString((char **)&local_d8,(char **)&local_70,input,cursor,(char *)local_b0,true,true);
          pbVar13 = (byte *)*cursor;
          goto LAB_005fde0b;
        default:
          uVar3 = local_60[0] - 0x59;
          if (0x13 < uVar3) goto switchD_005fdcc5_caseD_45;
          if ((0x92c00U >> (uVar3 & 0x1f) & 1) != 0) {
            local_48 = uVar15;
            local_74 = ReadWord(input,cursor,(char *)local_b0);
            uVar4 = ReadWord(input,cursor,(char *)pbVar13);
            uVar15 = local_48;
            uVar5 = ReadWord(input,cursor,(char *)pbVar13);
            if (uVar4 != 1) {
              if (uVar4 != 0) {
                local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_d8,"cannot ReadData, unknown encoding","");
                TokenizeError(&local_d8,(long)*local_b8 - (long)input);
              }
              uVar3 = (int)uVar15 - 99;
              iVar12 = 0;
              if ((byte)uVar3 < 10) {
                iVar12 = *(int *)(&DAT_006f2210 + (ulong)(uVar3 & 0xff) * 4);
              }
              if (iVar12 * local_74 != uVar5) {
                local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_d8,
                           "cannot ReadData, calculated data stride differs from what the file claims"
                           ,"");
                TokenizeError(&local_d8,(long)*local_b8 - (long)input);
              }
            }
            pbVar13 = (byte *)(*local_b8 + uVar5);
            cursor = local_b8;
            break;
          }
          if (uVar3 == 0) {
            pbVar13 = pbVar9 + 3;
            break;
          }
          if (uVar3 != 9) goto switchD_005fdcc5_caseD_45;
          *cursor = (char *)local_b0;
          goto LAB_005fde16;
        }
        *cursor = (char *)pbVar13;
LAB_005fde0b:
        if (local_b0 < pbVar13) {
          local_70 = local_60;
          local_60[0] = (byte)uVar15;
          local_68 = 1;
          local_60[1] = 0;
          plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x6f251f);
          local_d8._M_dataplus._M_p = (pointer)*plVar7;
          psVar10 = (size_type *)(plVar7 + 2);
          if ((size_type *)local_d8._M_dataplus._M_p == psVar10) {
            local_d8.field_2._M_allocated_capacity = *psVar10;
            local_d8.field_2._8_8_ = plVar7[3];
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          }
          else {
            local_d8.field_2._M_allocated_capacity = *psVar10;
          }
          local_d8._M_string_length = plVar7[1];
          *plVar7 = (long)psVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          TokenizeError(&local_d8,(long)*local_b8 - (long)input);
        }
LAB_005fde16:
        local_d8._M_dataplus._M_p = (pointer)operator_new(0x28);
        this = local_98;
        *(byte **)local_d8._M_dataplus._M_p = pbVar9;
        *(byte **)((long)local_d8._M_dataplus._M_p + 8) = pbVar13;
        *(undefined4 *)((long)local_d8._M_dataplus._M_p + 0x10) = 2;
        *(long *)((long)local_d8._M_dataplus._M_p + 0x18) = (long)pbVar13 - (long)input;
        *(undefined4 *)((long)local_d8._M_dataplus._M_p + 0x20) = 0xffffffff;
        std::vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>>::
        emplace_back<Assimp::FBX::Token_const*>(local_98,(Token **)&local_d8);
        cursor = local_b8;
        if (uVar1 != local_80) {
          local_d8._M_dataplus._M_p = (pointer)operator_new(0x28);
          pcVar17 = *cursor;
          *(char **)local_d8._M_dataplus._M_p = pcVar17;
          *(char **)((long)local_d8._M_dataplus._M_p + 8) = pcVar17 + 1;
          *(undefined4 *)((long)local_d8._M_dataplus._M_p + 0x10) = 4;
          *(long *)((long)local_d8._M_dataplus._M_p + 0x18) = (long)pcVar17 - (long)input;
          *(undefined4 *)((long)local_d8._M_dataplus._M_p + 0x20) = 0xffffffff;
          std::vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>>::
          emplace_back<Assimp::FBX::Token_const*>(this,(Token **)&local_d8);
        }
        bVar2 = uVar16 < local_a0;
        uVar11 = uVar16;
        uVar16 = (ulong)((int)uVar16 + 1);
        ppcVar14 = (char **)input;
      } while (bVar2);
      pcVar17 = *cursor;
      pcVar8 = local_50;
    }
    uVar1 = local_88;
    if ((long)pcVar17 - (long)pcVar8 != local_90) {
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d8,"property length not reached, something is wrong","");
      TokenizeError(&local_d8,(long)*local_b8 - (long)input);
    }
    pbVar9 = (byte *)0xfffffffffffffff3;
    if ((char)local_a4 != '\0') {
      pbVar9 = (byte *)0xffffffffffffffe7;
    }
    uVar11 = 0xd;
    if ((char)local_a4 != '\0') {
      uVar11 = 0x19;
    }
    uVar16 = (long)pcVar17 - (long)input;
    if (uVar16 < local_88) {
      local_b0 = pbVar9;
      if (local_88 - uVar16 < uVar11) {
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d8,"insufficient padding bytes at block end","");
        TokenizeError(&local_d8,(long)*local_b8 - (long)input);
      }
      local_d8._M_dataplus._M_p = (pointer)operator_new(0x28);
      *(char **)local_d8._M_dataplus._M_p = pcVar17;
      *(char **)(local_d8._M_dataplus._M_p + 8) = pcVar17 + 1;
      local_d8._M_dataplus._M_p[0x10] = '\0';
      local_d8._M_dataplus._M_p[0x11] = '\0';
      local_d8._M_dataplus._M_p[0x12] = '\0';
      local_d8._M_dataplus._M_p[0x13] = '\0';
      *(ulong *)(local_d8._M_dataplus._M_p + 0x18) = uVar16;
      local_d8._M_dataplus._M_p[0x20] = -1;
      local_d8._M_dataplus._M_p[0x21] = -1;
      local_d8._M_dataplus._M_p[0x22] = -1;
      local_d8._M_dataplus._M_p[0x23] = -1;
      std::vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>>::
      emplace_back<Assimp::FBX::Token_const*>(this,(Token **)&local_d8);
      pcVar17 = *cursor;
      uVar16 = (long)pcVar17 - (long)input;
      local_80 = uVar11;
      if (uVar16 < uVar1 - uVar11) {
        pbVar9 = local_b0 + (long)(input + local_88);
        bVar2 = (bool)(char)local_a4;
        do {
          ReadScope((TokenList *)local_98,input,cursor,(char *)pbVar9,bVar2);
          pcVar17 = *cursor;
          uVar16 = (long)pcVar17 - (long)input;
        } while (uVar16 < uVar1 - uVar11);
      }
      local_d8._M_dataplus._M_p = (pointer)operator_new(0x28);
      *(char **)local_d8._M_dataplus._M_p = pcVar17;
      *(char **)((long)local_d8._M_dataplus._M_p + 8) = pcVar17 + 1;
      *(undefined4 *)((long)local_d8._M_dataplus._M_p + 0x10) = 1;
      *(ulong *)((long)local_d8._M_dataplus._M_p + 0x18) = uVar16;
      *(undefined4 *)((long)local_d8._M_dataplus._M_p + 0x20) = 0xffffffff;
      std::vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>>::
      emplace_back<Assimp::FBX::Token_const*>(local_98,(Token **)&local_d8);
      lVar6 = 0;
      do {
        if ((*cursor)[lVar6] != '\0') {
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_d8,
                     "failed to read nested block sentinel, expected all bytes to be 0","");
          TokenizeError(&local_d8,(long)*local_b8 - (long)input);
        }
        lVar6 = lVar6 + 1;
      } while ((uint)lVar6 < (uint)local_80);
      pcVar17 = *cursor + local_80;
      *cursor = pcVar17;
      uVar16 = (long)pcVar17 - (long)input;
    }
    if (uVar16 != local_88) {
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d8,"scope length not reached, something is wrong","");
      TokenizeError(&local_d8,(long)*local_b8 - (long)input);
    }
  }
  return local_88 != 0;
}

Assistant:

bool ReadScope(TokenList& output_tokens, const char* input, const char*& cursor, const char* end, bool const is64bits)
{
    // the first word contains the offset at which this block ends
	const uint64_t end_offset = is64bits ? ReadDoubleWord(input, cursor, end) : ReadWord(input, cursor, end);

    // we may get 0 if reading reached the end of the file -
    // fbx files have a mysterious extra footer which I don't know
    // how to extract any information from, but at least it always
    // starts with a 0.
    if(!end_offset) {
        return false;
    }

    if(end_offset > Offset(input, end)) {
        TokenizeError("block offset is out of range",input, cursor);
    }
    else if(end_offset < Offset(input, cursor)) {
        TokenizeError("block offset is negative out of range",input, cursor);
    }

    // the second data word contains the number of properties in the scope
	const uint64_t prop_count = is64bits ? ReadDoubleWord(input, cursor, end) : ReadWord(input, cursor, end);

    // the third data word contains the length of the property list
	const uint64_t prop_length = is64bits ? ReadDoubleWord(input, cursor, end) : ReadWord(input, cursor, end);

    // now comes the name of the scope/key
    const char* sbeg, *send;
    ReadString(sbeg, send, input, cursor, end);

    output_tokens.push_back(new_Token(sbeg, send, TokenType_KEY, Offset(input, cursor) ));

    // now come the individual properties
    const char* begin_cursor = cursor;
    for (unsigned int i = 0; i < prop_count; ++i) {
        ReadData(sbeg, send, input, cursor, begin_cursor + prop_length);

        output_tokens.push_back(new_Token(sbeg, send, TokenType_DATA, Offset(input, cursor) ));

        if(i != prop_count-1) {
            output_tokens.push_back(new_Token(cursor, cursor + 1, TokenType_COMMA, Offset(input, cursor) ));
        }
    }

    if (Offset(begin_cursor, cursor) != prop_length) {
        TokenizeError("property length not reached, something is wrong",input, cursor);
    }

    // at the end of each nested block, there is a NUL record to indicate
    // that the sub-scope exists (i.e. to distinguish between P: and P : {})
    // this NUL record is 13 bytes long on 32 bit version and 25 bytes long on 64 bit.
	const size_t sentinel_block_length = is64bits ? (sizeof(uint64_t)* 3 + 1) : (sizeof(uint32_t)* 3 + 1);

    if (Offset(input, cursor) < end_offset) {
        if (end_offset - Offset(input, cursor) < sentinel_block_length) {
            TokenizeError("insufficient padding bytes at block end",input, cursor);
        }

        output_tokens.push_back(new_Token(cursor, cursor + 1, TokenType_OPEN_BRACKET, Offset(input, cursor) ));

        // XXX this is vulnerable to stack overflowing ..
        while(Offset(input, cursor) < end_offset - sentinel_block_length) {
			ReadScope(output_tokens, input, cursor, input + end_offset - sentinel_block_length, is64bits);
        }
        output_tokens.push_back(new_Token(cursor, cursor + 1, TokenType_CLOSE_BRACKET, Offset(input, cursor) ));

        for (unsigned int i = 0; i < sentinel_block_length; ++i) {
            if(cursor[i] != '\0') {
                TokenizeError("failed to read nested block sentinel, expected all bytes to be 0",input, cursor);
            }
        }
        cursor += sentinel_block_length;
    }

    if (Offset(input, cursor) != end_offset) {
        TokenizeError("scope length not reached, something is wrong",input, cursor);
    }

    return true;
}